

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_ManSavePattern(Cec_ManSat_t *p,Gia_Obj_t *pObj1,Gia_Obj_t *pObj2)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj2_local;
  Gia_Obj_t *pObj1_local;
  Cec_ManSat_t *p_local;
  
  Vec_IntClear(p->vCex);
  Gia_ManIncrementTravId(p->pAig);
  pGVar1 = p->pAig;
  pGVar2 = Gia_Regular(pObj1);
  Cec_ManSatSolveMiter_rec(p,pGVar1,pGVar2);
  if (pObj2 != (Gia_Obj_t *)0x0) {
    pGVar1 = p->pAig;
    pGVar2 = Gia_Regular(pObj2);
    Cec_ManSatSolveMiter_rec(p,pGVar1,pGVar2);
  }
  return;
}

Assistant:

void Cec_ManSavePattern( Cec_ManSat_t * p, Gia_Obj_t * pObj1, Gia_Obj_t * pObj2 )
{
    Vec_IntClear( p->vCex );
    Gia_ManIncrementTravId( p->pAig );
    Cec_ManSatSolveMiter_rec( p, p->pAig, Gia_Regular(pObj1) );
    if ( pObj2 )
    Cec_ManSatSolveMiter_rec( p, p->pAig, Gia_Regular(pObj2) );
}